

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_dec(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  undefined1 n [16];
  anon_class_16_2_cb75083a_for_f_conflict1 f;
  int num_digits_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  string_view prefix;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uStack_4c;
  int num_digits;
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
  *this_local;
  
  n._8_8_ = in_stack_ffffffffffffff90;
  n._0_8_ = in_stack_ffffffffffffff88;
  num_digits_00 = count_digits(*(detail **)&this->abs_value,(uint128_t)n);
  bVar1.container = (this->out).container;
  prefix = get_prefix(this);
  f._12_4_ = uStack_4c;
  f.num_digits = num_digits_00;
  f.this = this;
  bVar1 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>::on_dec()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                    (bVar1,num_digits_00,prefix,this->specs,f);
  (this->out).container = bVar1.container;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(
        out, num_digits, get_prefix(), specs, [this, num_digits](iterator it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }